

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQFunctionProto::SQFunctionProto(SQFunctionProto *this,SQSharedState *ss)

{
  SQInstruction *local_48;
  SQSharedState *ss_local;
  SQFunctionProto *this_local;
  
  SQCollectable::SQCollectable(&this->super_SQCollectable);
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQFunctionProto_00215358;
  ::SQObjectPtr::SQObjectPtr(&this->_sourcename);
  ::SQObjectPtr::SQObjectPtr(&this->_name);
  local_48 = this->_instructions;
  do {
    SQInstruction::SQInstruction(local_48);
    local_48 = local_48 + 1;
  } while ((SQFunctionProto *)local_48 != this + 1);
  this->_stacksize = 0;
  this->_bgenerator = false;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain
            (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQFunctionProto::SQFunctionProto(SQSharedState *ss)
{
    _stacksize=0;
    _bgenerator=false;
    INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);
}